

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufq.c
# Opt level: O3

_Bool Curl_bufq_peek_at(bufq *q,size_t offset,uchar **pbuf,size_t *plen)

{
  _Bool _Var1;
  buf_chunk *pbVar2;
  size_t sVar3;
  long lVar4;
  ulong uVar5;
  
  for (pbVar2 = q->head; pbVar2 != (buf_chunk *)0x0; pbVar2 = pbVar2->next) {
    sVar3 = pbVar2->w_offset;
    uVar5 = sVar3 - pbVar2->r_offset;
    if (uVar5 == 0) break;
    if (offset < uVar5) {
      lVar4 = pbVar2->r_offset + offset;
      *pbuf = (pbVar2->x).data + lVar4;
      sVar3 = sVar3 - lVar4;
      _Var1 = true;
      goto LAB_0014d737;
    }
    offset = offset - uVar5;
  }
  *pbuf = (uchar *)0x0;
  sVar3 = 0;
  _Var1 = false;
LAB_0014d737:
  *plen = sVar3;
  return _Var1;
}

Assistant:

bool Curl_bufq_peek_at(struct bufq *q, size_t offset,
                       const unsigned char **pbuf, size_t *plen)
{
  struct buf_chunk *c = q->head;
  size_t clen;

  while(c) {
    clen = chunk_len(c);
    if(!clen)
      break;
    if(offset >= clen) {
      offset -= clen;
      c = c->next;
      continue;
    }
    chunk_peek_at(c, offset, pbuf, plen);
    return TRUE;
  }
  *pbuf = NULL;
  *plen = 0;
  return FALSE;
}